

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall
QRenderRule::configurePalette(QRenderRule *this,QPalette *p,ColorGroup cg,QWidget *w,bool embedded)

{
  bool bVar1;
  BrushStyle BVar2;
  ColorRole CVar3;
  QStyleSheetBackgroundData *pQVar4;
  ulong uVar5;
  QColor *pQVar6;
  QStyleSheetPaletteData *pQVar7;
  ColorRole in_EDX;
  ColorGroup in_ESI;
  byte in_R8B;
  long in_FS_OFFSET;
  QBrush placeholder;
  QColor phColor;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  QStyleSheetBackgroundData *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  ColorGroup CVar8;
  QWidget *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined1 *local_28;
  QBrush local_20 [8];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = ::QSharedDataPointer::operator_cast_to_QStyleSheetBackgroundData_
                     ((QSharedDataPointer<QStyleSheetBackgroundData> *)
                      CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  if (pQVar4 != (QStyleSheetBackgroundData *)0x0) {
    QSharedDataPointer<QStyleSheetBackgroundData>::operator->
              ((QSharedDataPointer<QStyleSheetBackgroundData> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    BVar2 = QBrush::style((QBrush *)0x426187);
    if (BVar2 != NoBrush) {
      QSharedDataPointer<QStyleSheetBackgroundData>::operator->
                ((QSharedDataPointer<QStyleSheetBackgroundData> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      QPalette::setBrush(in_ESI,in_EDX,(QBrush *)0x9);
      QSharedDataPointer<QStyleSheetBackgroundData>::operator->
                ((QSharedDataPointer<QStyleSheetBackgroundData> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      QPalette::setBrush(in_ESI,in_EDX,(QBrush *)0x1);
      CVar3 = QWidget::backgroundRole((QWidget *)in_stack_fffffffffffffed8);
      QSharedDataPointer<QStyleSheetBackgroundData>::operator->
                ((QSharedDataPointer<QStyleSheetBackgroundData> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      QPalette::setBrush(in_ESI,in_EDX,(QBrush *)(ulong)CVar3);
      QSharedDataPointer<QStyleSheetBackgroundData>::operator->
                ((QSharedDataPointer<QStyleSheetBackgroundData> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      QPalette::setBrush(in_ESI,in_EDX,(QBrush *)0xa);
    }
  }
  if ((in_R8B & 1) == 0) goto LAB_004263e8;
  bVar1 = hasBackground((QRenderRule *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                       );
  if (bVar1) {
    background((QRenderRule *)0x426310);
    bVar1 = QStyleSheetBackgroundData::isTransparent(in_stack_fffffffffffffed8);
    if (!bVar1) goto LAB_0042631c;
  }
  else {
LAB_0042631c:
    bVar1 = hasBorder((QRenderRule *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    if (!bVar1) goto LAB_004263e8;
    border((QRenderRule *)0x42633f);
    bVar1 = QStyleSheetBorderData::hasBorderImage
                      ((QStyleSheetBorderData *)
                       CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    if (!bVar1) goto LAB_004263e8;
    border((QRenderRule *)0x42635d);
    QStyleSheetBorderData::borderImage((QStyleSheetBorderData *)0x426365);
    uVar5 = QPixmap::isNull();
    if ((uVar5 & 1) != 0) goto LAB_004263e8;
  }
  CVar3 = QWidget::backgroundRole((QWidget *)in_stack_fffffffffffffed8);
  QBrush::QBrush(local_20,NoBrush);
  QPalette::setBrush(in_ESI,in_EDX,(QBrush *)(ulong)CVar3);
  QBrush::~QBrush(local_20);
LAB_004263e8:
  bVar1 = hasPalette((QRenderRule *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  if (bVar1) {
    QSharedDataPointer<QStyleSheetPaletteData>::operator->
              ((QSharedDataPointer<QStyleSheetPaletteData> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    BVar2 = QBrush::style((QBrush *)0x42641b);
    if (BVar2 != NoBrush) {
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      setDefault((QPalette *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (ColorGroup)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 (ColorRole)in_stack_fffffffffffffee8,
                 (QBrush *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (QWidget *)in_stack_fffffffffffffed8);
      QWidget::foregroundRole(in_stack_fffffffffffffee8);
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      setDefault((QPalette *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (ColorGroup)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 (ColorRole)in_stack_fffffffffffffee8,
                 (QBrush *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (QWidget *)in_stack_fffffffffffffed8);
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      setDefault((QPalette *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (ColorGroup)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 (ColorRole)in_stack_fffffffffffffee8,
                 (QBrush *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (QWidget *)in_stack_fffffffffffffed8);
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      setDefault((QPalette *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (ColorGroup)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 (ColorRole)in_stack_fffffffffffffee8,
                 (QBrush *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (QWidget *)in_stack_fffffffffffffed8);
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      pQVar6 = QBrush::color((QBrush *)0x4265a4);
      local_18 = *(undefined1 **)pQVar6;
      local_10 = *(undefined1 **)((long)&pQVar6->ct + 4);
      QColor::alpha();
      QColor::setAlpha((int)&local_18);
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar7 = QSharedDataPointer<QStyleSheetPaletteData>::operator->
                         ((QSharedDataPointer<QStyleSheetPaletteData> *)
                          CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      QBrush::QBrush((QBrush *)&local_28,&pQVar7->foreground);
      QBrush::setColor((QColor *)&local_28);
      setDefault((QPalette *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (ColorGroup)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 (ColorRole)in_stack_fffffffffffffee8,
                 (QBrush *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (QWidget *)in_stack_fffffffffffffed8);
      QBrush::~QBrush((QBrush *)&local_28);
    }
    QSharedDataPointer<QStyleSheetPaletteData>::operator->
              ((QSharedDataPointer<QStyleSheetPaletteData> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    BVar2 = QBrush::style((QBrush *)0x42667e);
    if (BVar2 != NoBrush) {
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      QPalette::setBrush(in_ESI,in_EDX,(QBrush *)0xc);
    }
    QSharedDataPointer<QStyleSheetPaletteData>::operator->
              ((QSharedDataPointer<QStyleSheetPaletteData> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    BVar2 = QBrush::style((QBrush *)0x4266e3);
    if (BVar2 != NoBrush) {
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      QPalette::setBrush(in_ESI,in_EDX,(QBrush *)0xd);
    }
    QSharedDataPointer<QStyleSheetPaletteData>::operator->
              ((QSharedDataPointer<QStyleSheetPaletteData> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    BVar2 = QBrush::style((QBrush *)0x426748);
    if (BVar2 != NoBrush) {
      CVar3 = in_EDX;
      CVar8 = in_ESI;
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      QPalette::setBrush(CVar8,CVar3,(QBrush *)0x10);
    }
    QSharedDataPointer<QStyleSheetPaletteData>::operator->
              ((QSharedDataPointer<QStyleSheetPaletteData> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    BVar2 = QBrush::style((QBrush *)0x4267ad);
    if (BVar2 != NoBrush) {
      CVar3 = in_EDX;
      CVar8 = in_ESI;
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      QPalette::setBrush(CVar8,CVar3,(QBrush *)0x14);
    }
    QSharedDataPointer<QStyleSheetPaletteData>::operator->
              ((QSharedDataPointer<QStyleSheetPaletteData> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    BVar2 = QBrush::style((QBrush *)0x426812);
    if (BVar2 != NoBrush) {
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)
                 CONCAT44(in_EDX,in_stack_fffffffffffffed0));
      QPalette::setBrush(in_ESI,in_EDX,(QBrush *)0x15);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRenderRule::configurePalette(QPalette *p, QPalette::ColorGroup cg, const QWidget *w, bool embedded)
{
    if (bg && bg->brush.style() != Qt::NoBrush) {
        p->setBrush(cg, QPalette::Base, bg->brush); // for windows, windowxp
        p->setBrush(cg, QPalette::Button, bg->brush); // for plastique
        p->setBrush(cg, w->backgroundRole(), bg->brush);
        p->setBrush(cg, QPalette::Window, bg->brush);
    }

    if (embedded) {
        /* For embedded widgets (ComboBox, SpinBox and ScrollArea) we want the embedded widget
         * to be transparent when we have a transparent background or border image */
        if ((hasBackground() && background()->isTransparent())
            || (hasBorder() && border()->hasBorderImage() && !border()->borderImage()->pixmap.isNull()))
            p->setBrush(cg, w->backgroundRole(), Qt::NoBrush);
    }

    if (!hasPalette())
        return;

    if (pal->foreground.style() != Qt::NoBrush) {
        setDefault(p, cg, QPalette::ButtonText, pal->foreground, w);
        setDefault(p, cg, w->foregroundRole(), pal->foreground, w);
        setDefault(p, cg, QPalette::WindowText, pal->foreground, w);
        setDefault(p, cg, QPalette::Text, pal->foreground, w);
        QColor phColor(pal->foreground.color());
        phColor.setAlpha((phColor.alpha() + 1) / 2);
        QBrush placeholder = pal->foreground;
        placeholder.setColor(phColor);
        setDefault(p, cg, QPalette::PlaceholderText, placeholder, w);
    }
    if (pal->selectionBackground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::Highlight, pal->selectionBackground);
    if (pal->selectionForeground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::HighlightedText, pal->selectionForeground);
    if (pal->alternateBackground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::AlternateBase, pal->alternateBackground);
    if (pal->placeholderForeground.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::PlaceholderText, pal->placeholderForeground);
    if (pal->accent.style() != Qt::NoBrush)
        p->setBrush(cg, QPalette::Accent, pal->accent);
}